

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::QueryBufferStorageTestCase::QueryBufferStorageTestCase
          (QueryBufferStorageTestCase *this,Functions *gl,TestContext *testContext,GLint page_size)

{
  GLint page_size_local;
  TestContext *testContext_local;
  Functions *gl_local;
  QueryBufferStorageTestCase *this_local;
  
  BufferStorageTestCase::BufferStorageTestCase(&this->super_BufferStorageTestCase);
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__QueryBufferStorageTestCase_0323cb80;
  this->m_gl = gl;
  this->m_helper_bo = 0;
  this->m_n_triangles = 0xf;
  this->m_page_size = page_size;
  this->m_po = 0;
  this->m_qo = 0;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_size = 0;
  this->m_sparse_bo_size_rounded = 0;
  this->m_testCtx = testContext;
  this->m_vao = 0;
  return;
}

Assistant:

QueryBufferStorageTestCase::QueryBufferStorageTestCase(const glw::Functions& gl, tcu::TestContext& testContext,
													   glw::GLint page_size)
	: m_gl(gl)
	, m_helper_bo(0)
	, m_n_triangles(15)
	, m_page_size(page_size)
	, m_po(0)
	, m_qo(0)
	, m_sparse_bo(0)
	, m_sparse_bo_size(0)
	, m_sparse_bo_size_rounded(0)
	, m_testCtx(testContext)
	, m_vao(0)
{
	/* Left blank on purpose */
}